

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_flush(void)

{
  if (Term != (term *)0x0) {
    Term_xtra(L'\x02',L'\0');
    Term->key_tail = 0;
    Term->key_head = 0;
  }
  return 0;
}

Assistant:

errr Term_flush(void)
{
	if (!Term)
		return 0;

	/* Hack -- Flush all events */
	Term_xtra(TERM_XTRA_FLUSH, 0);

	/* Forget all keypresses */
	Term->key_head = Term->key_tail = 0;

	/* Success */
	return (0);
}